

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::Matcher
          (Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *this,
          pair<int,_phmap::priv::NonStandardLayout> *value)

{
  MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> MStack_88;
  pair<int,_phmap::priv::NonStandardLayout> local_70;
  pair<int,_phmap::priv::NonStandardLayout> local_40;
  
  (this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>).buffer_.ptr =
       (void *)0x0;
  (this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002be910;
  std::pair<int,_phmap::priv::NonStandardLayout>::pair(&local_70,value);
  std::pair<int,_phmap::priv::NonStandardLayout>::pair(&local_40,&local_70);
  Matcher<std::pair<int,phmap::priv::NonStandardLayout>const&>::
  Matcher<testing::internal::EqMatcher<std::pair<int,phmap::priv::NonStandardLayout>>,void>
            ((Matcher<std::pair<int,phmap::priv::NonStandardLayout>const&> *)&MStack_88,
             (EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_> *)&local_40);
  internal::MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::operator=
            (&this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>,
             &MStack_88);
  internal::MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::~MatcherBase
            (&MStack_88);
  phmap::priv::NonStandardLayout::~NonStandardLayout(&local_40.second);
  phmap::priv::NonStandardLayout::~NonStandardLayout(&local_70.second);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}